

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestDyndepFileSecondNotReady::Run(GraphTestDyndepFileSecondNotReady *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  string err;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild dd1: r dd1-in\nbuild dd2-in: r || dd1\n  dyndep = dd1\nbuild dd2: r dd2-in\nbuild out: r || dd2\n  dyndep = dd2\n"
              ,(ManifestParserOptions)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dd1",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  this_00 = &(this->super_GraphTest).fs_;
  VirtualFileSystem::Create(this_00,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dd2",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  VirtualFileSystem::Create(this_00,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dd2-in",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  VirtualFileSystem::Create(this_00,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  piVar1 = &(this->super_GraphTest).fs_.now_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dd1-in",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  VirtualFileSystem::Create(this_00,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"out",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  VirtualFileSystem::Create(this_00,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  pTVar2 = g_current_test;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"out",&local_5a);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
  bVar3 = DependencyScan::RecomputeDirty
                    (&(this->super_GraphTest).scan_,pNVar4,
                     (vector<Node_*,_std::allocator<Node_*>_> *)0x0,&local_38);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc",
             0x374,"scan_.RecomputeDirty(GetNode(\"out\"), NULL, &err)");
  std::__cxx11::string::~string((string *)&local_58);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&local_38);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                     ,0x375,"\"\" == err");
  pTVar2 = g_current_test;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dd1",&local_5a);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
    testing::Test::Check
              (pTVar2,pNVar4->dirty_,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x377,"GetNode(\"dd1\")->dirty()");
    std::__cxx11::string::~string((string *)&local_58);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dd1",&local_5a);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
    testing::Test::Check
              (pTVar2,(bool)(pNVar4->in_edge_->outputs_ready_ ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x378,"GetNode(\"dd1\")->in_edge()->outputs_ready()");
    std::__cxx11::string::~string((string *)&local_58);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dd2",&local_5a);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
    testing::Test::Check
              (pTVar2,(bool)(pNVar4->dirty_ ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x379,"GetNode(\"dd2\")->dirty()");
    std::__cxx11::string::~string((string *)&local_58);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dd2",&local_5a);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
    testing::Test::Check
              (pTVar2,(bool)(pNVar4->in_edge_->outputs_ready_ ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x37a,"GetNode(\"dd2\")->in_edge()->outputs_ready()");
    std::__cxx11::string::~string((string *)&local_58);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"out",&local_5a);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
    testing::Test::Check
              (pTVar2,(bool)(pNVar4->dirty_ ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x37b,"GetNode(\"out\")->dirty()");
    std::__cxx11::string::~string((string *)&local_58);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"out",&local_5a);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
    testing::Test::Check
              (pTVar2,(bool)(pNVar4->in_edge_->outputs_ready_ ^ 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x37c,"GetNode(\"out\")->in_edge()->outputs_ready()");
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

TEST_F(GraphTest, DyndepFileSecondNotReady) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build dd1: r dd1-in\n"
"build dd2-in: r || dd1\n"
"  dyndep = dd1\n"
"build dd2: r dd2-in\n"
"build out: r || dd2\n"
"  dyndep = dd2\n"
  );
  fs_.Create("dd1", "");
  fs_.Create("dd2", "");
  fs_.Create("dd2-in", "");
  fs_.Tick();
  fs_.Create("dd1-in", "");
  fs_.Create("out", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out"), NULL, &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(GetNode("dd1")->dirty());
  EXPECT_FALSE(GetNode("dd1")->in_edge()->outputs_ready());
  EXPECT_FALSE(GetNode("dd2")->dirty());
  EXPECT_FALSE(GetNode("dd2")->in_edge()->outputs_ready());
  EXPECT_FALSE(GetNode("out")->dirty());
  EXPECT_FALSE(GetNode("out")->in_edge()->outputs_ready());
}